

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.cpp
# Opt level: O2

int __thiscall
jbcoin::verify(jbcoin *this,STObject *st,HashPrefix *prefix,PublicKey *pk,SF_Blob *sigField)

{
  uint8_t *puVar1;
  int iVar2;
  pointer_const_type pSVar3;
  Serializer ss;
  pointer local_58;
  long local_50;
  optional<jbcoin::Slice> sig;
  uint8_t *local_30;
  size_t local_28;
  
  get<jbcoin::Slice,jbcoin::STBlob>(&sig,this,(STObject *)pk,(TypedField<jbcoin::STBlob> *)pk);
  if (sig.super_type.m_initialized == true) {
    Serializer::Serializer(&ss,0x100);
    Serializer::add32(&ss,*(uint32_t *)&(st->super_STBase)._vptr_STBase);
    STObject::addWithoutSigningFields((STObject *)this,&ss);
    local_50 = (long)ss.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)ss.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    local_58 = ss.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    pSVar3 = boost::optional<jbcoin::Slice>::operator->(&sig);
    puVar1 = pSVar3->data_;
    pSVar3 = boost::optional<jbcoin::Slice>::operator->(&sig);
    local_28 = pSVar3->size_;
    local_30 = puVar1;
    iVar2 = verify((EVP_PKEY_CTX *)prefix,(uchar *)&local_58,(size_t)&local_30,(uchar *)0x1,
                   (size_t)sigField);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ss);
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

bool
verify (STObject const& st, HashPrefix const& prefix,
    PublicKey const& pk, SF_Blob const& sigField)
{
    auto const sig = get(st, sigField);
    if (! sig)
        return false;
    Serializer ss;
    ss.add32(prefix);
    st.addWithoutSigningFields(ss);
    return verify(pk,
        Slice(ss.data(), ss.size()),
            Slice(sig->data(), sig->size()));
}